

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  long lVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  uint uVar4;
  _Bool _Var5;
  uint uVar6;
  sparc_reg sVar7;
  MCOperand *op;
  int64_t iVar8;
  ulong uVar9;
  char *fmt;
  int iVar10;
  
  op = MCInst_getOperand(MI,opNum);
  _Var5 = MCOperand_isReg(op);
  if (_Var5) {
    uVar6 = MCOperand_getReg(op);
    SStream_concat0(O,"%");
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar6 - 1) * 4));
    sVar7 = Sparc_map_register(uVar6);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar3 = MI->flat_insn->detail;
    uVar9 = (ulong)(pcVar3->field_6).x86.rex;
    if (MI->csh->doing_mem == true) {
      lVar1 = uVar9 * 0xc;
      if (pcVar3->groups[lVar1 + 0x1e] != '\0') {
        pcVar3->groups[lVar1 + 0x1f] = (uint8_t)sVar7;
        return;
      }
      pcVar3->groups[lVar1 + 0x1e] = (uint8_t)sVar7;
      return;
    }
    puVar2 = pcVar3->groups + uVar9 * 0xc + 0x1a;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    *(sparc_reg *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.rex * 0xc + 0x1e) = sVar7;
    goto LAB_001c2344;
  }
  _Var5 = MCOperand_isImm(op);
  if (!_Var5) {
    return;
  }
  iVar8 = MCOperand_getImm(op);
  uVar6 = (uint)iVar8;
  switch(MI->Opcode) {
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x95:
  case 0x96:
    iVar10 = (int)(uVar6 << 10) >> 8;
    break;
  default:
    goto switchD_001c224c_caseD_4a;
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
    iVar10 = (int)(uVar6 << 0xd) >> 0xb;
    break;
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
    iVar10 = (int)(short)iVar8 << 2;
    break;
  case 0x72:
    iVar10 = (int)(uVar6 << 2) >> 2;
  }
  uVar6 = iVar10 + (int)MI->address;
switchD_001c224c_caseD_4a:
  if ((int)uVar6 < 0) {
    uVar4 = -uVar6;
    if ((int)uVar6 < -9) {
      fmt = "-0x%x";
    }
    else {
      fmt = "-%u";
    }
  }
  else {
    uVar4 = uVar6;
    if ((int)uVar6 < 10) {
      fmt = "%u";
    }
    else {
      fmt = "0x%x";
    }
  }
  SStream_concat(O,fmt,(ulong)uVar4);
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar3 = MI->flat_insn->detail;
  uVar9 = (ulong)(pcVar3->field_6).x86.rex;
  if (MI->csh->doing_mem == true) {
    *(uint *)(pcVar3->groups + uVar9 * 0xc + 0x22) = uVar6;
    return;
  }
  puVar2 = pcVar3->groups + uVar9 * 0xc + 0x1a;
  puVar2[0] = '\x02';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  pcVar3 = MI->flat_insn->detail;
  *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.rex * 0xc + 0x1e) = uVar6;
LAB_001c2344:
  puVar2 = &(MI->flat_insn->detail->field_6).x86.rex;
  *puVar2 = *puVar2 + '\x01';
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	uint8_t opsize = 0;
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);
		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		// Print X86 immediates as signed values.
		int64_t imm = MCOperand_getImm(Op);

		switch(MCInst_getOpcode(MI)) {
			default:
				break;

			case X86_AAD8i8:
			case X86_AAM8i8:
			case X86_ADC8i8:
			case X86_ADD8i8:
			case X86_AND8i8:
			case X86_CMP8i8:
			case X86_OR8i8:
			case X86_SBB8i8:
			case X86_SUB8i8:
			case X86_TEST8i8:
			case X86_XOR8i8:
			case X86_ROL8ri:
			case X86_ADC8ri:
			case X86_ADD8ri:
			case X86_ADD8ri8:
			case X86_AND8ri:
			case X86_AND8ri8:
			case X86_CMP8ri:
			case X86_MOV8ri:
			case X86_MOV8ri_alt:
			case X86_OR8ri:
			case X86_OR8ri8:
			case X86_RCL8ri:
			case X86_RCR8ri:
			case X86_ROR8ri:
			case X86_SAL8ri:
			case X86_SAR8ri:
			case X86_SBB8ri:
			case X86_SHL8ri:
			case X86_SHR8ri:
			case X86_SUB8ri:
			case X86_SUB8ri8:
			case X86_TEST8ri:
			case X86_TEST8ri_NOREX:
			case X86_TEST8ri_alt:
			case X86_XOR8ri:
			case X86_XOR8ri8:
			case X86_OUT8ir:

			case X86_ADC8mi:
			case X86_ADD8mi:
			case X86_AND8mi:
			case X86_CMP8mi:
			case X86_LOCK_ADD8mi:
			case X86_LOCK_AND8mi:
			case X86_LOCK_OR8mi:
			case X86_LOCK_SUB8mi:
			case X86_LOCK_XOR8mi:
			case X86_MOV8mi:
			case X86_OR8mi:
			case X86_RCL8mi:
			case X86_RCR8mi:
			case X86_ROL8mi:
			case X86_ROR8mi:
			case X86_SAL8mi:
			case X86_SAR8mi:
			case X86_SBB8mi:
			case X86_SHL8mi:
			case X86_SHR8mi:
			case X86_SUB8mi:
			case X86_TEST8mi:
			case X86_TEST8mi_alt:
			case X86_XOR8mi:
			case X86_PUSH64i8:
			case X86_CMP32ri8:
			case X86_CMP64ri8:

				imm = imm & 0xff;
				opsize = 1;     // immediate of 1 byte
				break;
		}

		switch(MI->flat_insn->id) {
			default:
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "$0x%"PRIx64, imm);
					else
						SStream_concat(O, "$%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "$-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "$-%"PRIu64, -imm);
				}
				break;

			case X86_INS_INT:
				// do not print number in negative form
				imm = imm & 0xff;
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					SStream_concat(O, "$0x%x", imm);
				}
				break;

			case X86_INS_LCALL:
			case X86_INS_LJMP:
				// always print address in positive form
				if (OpNo == 1) { // selector is ptr16
					imm = imm & 0xffff;
					opsize = 2;
				}
				SStream_concat(O, "$0x%"PRIx64, imm);
				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = arch_masks[MI->op1_size? MI->op1_size : MI->imm_size] & imm;
					SStream_concat(O, "$0x%"PRIx64, imm);
				}
				break;

			case X86_INS_RET:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "$%u", imm);
				else {
					imm = 0xffff & imm;
					SStream_concat(O, "$0x%x", imm);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				MI->has_imm = true;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;

				if (opsize > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = opsize;
				else if (MI->op1_size > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->op1_size;
				else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;

				MI->flat_insn->detail->x86.op_count++;
			}
		}
	}
}